

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void kratos::merge_bundle_mapping
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Generator_*>_>_>_>_>_>
                *old_mapping)

{
  PortDirection direction;
  key_type port_name;
  undefined1 auVar1 [8];
  pointer pbVar2;
  uint uVar3;
  undefined4 uVar4;
  _Rb_tree_node_base *p_Var5;
  iterator iVar6;
  mapped_type_conflict *pmVar7;
  _Base_ptr p_Var8;
  long lVar9;
  PortPackedStruct *this;
  PackedSlice *new_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  InternalException *pIVar11;
  UserException *pUVar12;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string *port_name_00;
  undefined1 auVar15 [8];
  _Rb_tree_node_base *p_Var16;
  bool bVar17;
  basic_string_view<char> bVar18;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  undefined1 local_188 [8];
  map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
  bundle_hashs;
  shared_ptr<kratos::PortBundleRef> ref_port_ref;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
  def;
  size_type local_120;
  undefined1 local_110 [8];
  shared_ptr<kratos::PortBundleRef> ref;
  undefined1 local_f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  _func_int **local_c8;
  undefined1 auStack_c0 [8];
  undefined1 auStack_b8 [8];
  shared_ptr<kratos::PortBundleRef> ref_1;
  undefined1 local_90 [8];
  uint64_t hash;
  undefined8 local_80;
  undefined1 local_78 [8];
  shared_ptr<kratos::PackedStruct> struct_;
  undefined1 auStack_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ports;
  undefined8 local_38;
  
  _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (old_mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)_Var10._M_pi == &(old_mapping->_M_t)._M_impl.super__Rb_tree_header) {
      return;
    }
    local_80 = (long)_Var10._M_pi + 0x20;
    bundle_hashs._M_t._M_impl._0_4_ = 0;
    bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&bundle_hashs;
    bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    p_Var13 = ((_Base_ptr)((long)_Var10._M_pi + 0x40))->_M_parent;
    port_name_00 = (string *)0x0;
    bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var10._M_pi;
    for (p_Var8 = *(_Base_ptr *)((long)_Var10._M_pi + 0x40); p_Var8 != p_Var13;
        p_Var8 = (_Base_ptr)&p_Var8[1]._M_parent) {
      Generator::get_bundle_ref((Generator *)local_110,*(string **)(p_Var8 + 1));
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&ref_port_ref.
                     super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)local_110 + 0xc0));
      auStack_58 = (undefined1  [8])0x0;
      ports.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ports.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_58,local_120);
      p_Var14 = p_Var8 + 1;
      for (p_Var5 = (_Rb_tree_node_base *)
                    def.
                    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          p_Var5 != (_Rb_tree_node_base *)&def;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)auStack_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var5 + 1)
                  );
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (auStack_58,
                 ports.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      pbVar2 = ports.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_78 = (undefined1  [8])
                 &struct_.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
      struct_.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      struct_.super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ._0_1_ = 0;
      for (auVar15 = auStack_58; auVar15 != (undefined1  [8])pbVar2;
          auVar15 = (undefined1  [8])&(((Var *)auVar15)->super_IRNode).verilog_ln) {
        port_name = *(key_type *)p_Var14;
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount,(key_type *)auVar15);
        Generator::get_port((Generator *)local_90,(string *)port_name);
        auVar1 = local_90;
        uVar3 = (**(code **)(*(_func_int **)local_90 + 0x38))(local_90);
        local_f8 = (undefined1  [8])
                   (ulong)*(uint *)&(((string *)((long)auVar1 + 0x98))->_M_dataplus)._M_p;
        local_e8._M_allocated_capacity = (size_type)uVar3;
        local_d8._M_allocated_capacity = (size_type)*(byte *)((long)local_90 + 0xf0);
        local_c8 = (((Var *)auVar15)->super_IRNode)._vptr_IRNode;
        auStack_c0 = (undefined1  [8])
                     (((Var *)auVar15)->super_IRNode).fn_name_ln.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        bVar18 = fmt::v7::to_string_view<char,_0>("{0}{1}{2}{3}");
        format_str.data_ = (char *)bVar18.size_;
        format_str.size_ = 0xd722;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)local_f8;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)auStack_b8,(detail *)bVar18.data_,format_str,args);
        std::__cxx11::string::append((string *)local_78);
        std::__cxx11::string::~string((string *)auStack_b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&hash);
      }
      local_90 = (undefined1  [8])
                 hash_64_fnv1a((void *)local_78,
                               (uint64_t)
                               struct_.
                               super___shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr);
      _Var10 = ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ;
      iVar6 = std::
              _Rb_tree<kratos::Generator_*,_std::pair<kratos::Generator_*const,_unsigned_long>,_std::_Select1st<std::pair<kratos::Generator_*const,_unsigned_long>_>,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
              ::find((_Rb_tree<kratos::Generator_*,_std::pair<kratos::Generator_*const,_unsigned_long>,_std::_Select1st<std::pair<kratos::Generator_*const,_unsigned_long>_>,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                      *)local_188,(key_type *)p_Var14);
      if ((iVar6._M_node != (_Base_ptr)&bundle_hashs) &&
         (pmVar7 = std::
                   map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                   ::at((map<kratos::Generator_*,_unsigned_long,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                         *)local_188,(key_type *)p_Var14), (undefined1  [8])*pmVar7 != local_90)) {
        pUVar12 = (UserException *)__cxa_allocate_exception(0x10);
        auStack_b8 = (undefined1  [8])_Var10._M_pi[2]._vptr__Sp_counted_base;
        ref_1.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             *(element_type **)&_Var10._M_pi[2]._M_use_count;
        bVar18 = fmt::v7::to_string_view<char,_0>
                           ("Port bundle with same name {0} have different definition");
        format_str_00.data_ = (char *)bVar18.size_;
        format_str_00.size_ = 0xd;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_00.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)auStack_b8;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_f8,(detail *)bVar18.data_,format_str_00,args_00);
        UserException::UserException(pUVar12,(string *)local_f8);
        __cxa_throw(pUVar12,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      _Rb_tree<kratos::Generator*,std::pair<kratos::Generator*const,unsigned_long>,std::_Select1st<std::pair<kratos::Generator*const,unsigned_long>>,std::less<kratos::Generator*>,std::allocator<std::pair<kratos::Generator*const,unsigned_long>>>
      ::_M_emplace_unique<kratos::Generator*const&,unsigned_long&>
                ((_Rb_tree<kratos::Generator*,std::pair<kratos::Generator*const,unsigned_long>,std::_Select1st<std::pair<kratos::Generator*const,unsigned_long>>,std::less<kratos::Generator*>,std::allocator<std::pair<kratos::Generator*const,unsigned_long>>>
                  *)local_188,(Generator **)p_Var14,(unsigned_long *)local_90);
      port_name_00 = *(string **)(p_Var8 + 1);
      std::__shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2> *)
                 &bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (__shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2> *)local_110);
      std::__cxx11::string::~string((string *)local_78);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_58);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&ref_port_ref.
                      super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ref);
    }
    bVar17 = false;
    p_Var8 = bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var13 = (_Base_ptr)0x0;
    while (p_Var8 != (_Rb_tree_node_base *)&bundle_hashs) {
      p_Var14 = p_Var8[1]._M_parent;
      if ((bVar17) && (bVar17 = p_Var13 != p_Var14, p_Var14 = p_Var13, bVar17)) {
        pUVar12 = (UserException *)__cxa_allocate_exception(0x10);
        ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)_Var10._M_pi + 0x20);
        def.
        super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)((_Base_ptr)((long)_Var10._M_pi + 0x20))->_M_parent;
        bVar18 = fmt::v7::to_string_view<char,_0>
                           ("Port bundle with same name {0} have different definition");
        format_str_01.data_ = (char *)bVar18.size_;
        format_str_01.size_ = 0xd;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_01.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)
                 &ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)local_f8,(detail *)bVar18.data_,format_str_01,args_01);
        UserException::UserException(pUVar12,(string *)local_f8);
        __cxa_throw(pUVar12,&UserException::typeinfo,std::runtime_error::~runtime_error);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      bVar17 = true;
      p_Var13 = p_Var14;
    }
    if (port_name_00 == (string *)0x0) {
      pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_f8,"ref generator cannot be null",
                 (allocator<char> *)
                 &ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      InternalException::InternalException(pIVar11,(string *)local_f8);
      __cxa_throw(pIVar11,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    def.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    def.
    super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    p_Var16 = (_Rb_tree_node_base *)
              (bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_node_count + 200);
    for (p_Var5 = *(_Rb_tree_node_base **)
                   (bundle_hashs._M_t._M_impl.super__Rb_tree_header._M_node_count + 0xd8);
        p_Var5 != p_Var16; p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      Generator::get_port((Generator *)local_78,port_name_00);
      uVar4 = (**(code **)&(*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_78)[3].
                           _M_use_count)();
      auStack_b8._0_4_ = uVar4;
      std::_Tuple_impl<0ul,std::__cxx11::string,unsigned_int,bool>::
      _Tuple_impl<std::__cxx11::string_const&,unsigned_int,bool&,void>
                ((_Tuple_impl<0ul,std::__cxx11::string,unsigned_int,bool> *)local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var5 + 1),
                 (uint *)auStack_b8,(bool *)((long)local_78 + 0xf0));
      std::
      vector<std::tuple<std::__cxx11::string,unsigned_int,bool>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,bool>>>
      ::emplace_back<std::tuple<std::__cxx11::string,unsigned_int,bool>>
                ((vector<std::tuple<std::__cxx11::string,unsigned_int,bool>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,bool>>>
                  *)&ref_port_ref.
                     super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,
                 (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
                  *)local_f8);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&struct_);
    }
    std::
    make_shared<kratos::PackedStruct,std::__cxx11::string_const&,std::vector<std::tuple<std::__cxx11::string,unsigned_int,bool>,std::allocator<std::tuple<std::__cxx11::string,unsigned_int,bool>>>&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
               (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
                *)local_80);
    p_Var13 = ((_Base_ptr)((long)_Var10._M_pi + 0x40))->_M_parent;
    p_Var8 = *(_Base_ptr *)((long)_Var10._M_pi + 0x40);
    for (; p_Var8 != p_Var13; p_Var8 = (_Base_ptr)&p_Var8[1]._M_parent) {
      lVar9 = (**(code **)(**(long **)(p_Var8 + 1) + 0x20))();
      if (lVar9 == 0) {
        local_38 = (Generator *)0x0;
      }
      else {
        local_38 = __dynamic_cast(lVar9,&IRNode::typeinfo,&Generator::typeinfo,0);
      }
      Generator::get_bundle_ref((Generator *)auStack_b8,*(string **)(p_Var8 + 1));
      auVar15 = auStack_b8;
      Generator::get_port((Generator *)local_f8,*(string **)(p_Var8 + 1));
      direction = *(PortDirection *)((long)local_f8 + 0x270);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
      this = Generator::port_packed
                       (*(Generator **)(p_Var8 + 1),direction,(string *)p_Var8,
                        (shared_ptr<kratos::PackedStruct> *)local_78);
      local_80 = (long)auVar15 + 200;
      for (p_Var5 = (_Rb_tree_node_base *)
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)auVar15 + 0xd8))->_M_pi;
          p_Var5 != (_Rb_tree_node_base *)local_80;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        Generator::get_port((Generator *)auStack_58,*(string **)(p_Var8 + 1));
        new_var = PortPackedStruct::operator[](this,(string *)(p_Var5 + 1));
        if (direction !=
            *(PortDirection *)&(((Var *)((long)auStack_58 + 0x270))->super_IRNode)._vptr_IRNode) {
          pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_f8,"Direction doesn\'t match",(allocator<char> *)local_110);
          InternalException::InternalException(pIVar11,(string *)local_f8);
          __cxa_throw(pIVar11,&InternalException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (direction == In) {
          if ((Generator *)local_38 != (Generator *)0x0) {
            Var::move_src_to((Var *)auStack_58,(Var *)new_var,(Generator *)local_38,false);
          }
          Var::move_sink_to((Var *)auStack_58,(Var *)new_var,*(Generator **)(p_Var8 + 1),false);
        }
        else {
          Var::move_src_to((Var *)auStack_58,(Var *)new_var,*(Generator **)(p_Var8 + 1),false);
          if ((Generator *)local_38 != (Generator *)0x0) {
            Var::move_sink_to((Var *)auStack_58,(Var *)new_var,(Generator *)local_38,false);
          }
        }
        Generator::remove_port(*(Generator **)(p_Var8 + 1),(string *)(p_Var5 + 2));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ports);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>_>
      ::erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::PortBundleRef>_>_>_>
               *)(*(long *)(p_Var8 + 1) + 0x1c8),(key_type *)p_Var8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ref_1);
      _Var10 = ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&struct_);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
    ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
               *)&ref_port_ref.super___shared_ptr<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ref_port_ref);
    std::
    _Rb_tree<kratos::Generator_*,_std::pair<kratos::Generator_*const,_unsigned_long>,_std::_Select1st<std::pair<kratos::Generator_*const,_unsigned_long>_>,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
    ::~_Rb_tree((_Rb_tree<kratos::Generator_*,_std::pair<kratos::Generator_*const,_unsigned_long>,_std::_Select1st<std::pair<kratos::Generator_*const,_unsigned_long>_>,_std::less<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_unsigned_long>_>_>
                 *)local_188);
    _Var10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   std::_Rb_tree_increment(_Var10._M_pi);
  } while( true );
}

Assistant:

void merge_bundle_mapping(
    const std::map<std::string, std::vector<std::pair<std::string, Generator*>>>& old_mapping) {
    for (auto const& [bundle_name, generators] : old_mapping) {
        std::map<Generator*, uint64_t> bundle_hashs;
        std::shared_ptr<PortBundleRef> ref_port_ref;
        Generator* ref_generator = nullptr;
        for (auto const& [entry_name, generator] : generators) {
            auto ref = generator->get_bundle_ref(entry_name);
            auto mappings = ref->name_mappings();
            std::vector<std::string> ports;
            ports.reserve(mappings.size());
            for (auto const& iter : mappings) {
                ports.emplace_back(iter.first);
            }
            std::sort(ports.begin(), ports.end());
            std::string base_str;
            for (auto const& port_name : ports) {
                auto port = generator->get_port(mappings.at(port_name));
                base_str.append(::format("{0}{1}{2}{3}", port->var_width(), port->width(),
                                         port->is_signed(), port_name));
            }
            uint64_t hash = hash_64_fnv1a(base_str.c_str(), base_str.size());
            if (bundle_hashs.find(generator) != bundle_hashs.end()) {
                if (bundle_hashs.at(generator) != hash)
                    throw UserException(::format(
                        "Port bundle with same name {0} have different definition", bundle_name));
            }
            bundle_hashs.emplace(generator, hash);

            ref_generator = generator;
            ref_port_ref = ref;
        }
        // for now we require the naming of the bundle has to be the same
        bool initialized = false;
        uint64_t base_hash = 0;
        for (auto const& iter : bundle_hashs) {
            uint64_t hash = iter.second;
            if (!initialized) {
                initialized = true;
                base_hash = hash;
            } else {
                if (base_hash != hash) {
                    throw UserException(::format(
                        "Port bundle with same name {0} have different definition", bundle_name));
                }
            }
        }
        if (!ref_generator) throw InternalException("ref generator cannot be null");
        // create a packed struct
        std::vector<std::tuple<std::string, uint32_t, bool>> def;
        auto const& mapping = ref_port_ref->name_mappings();
        for (auto const& [var_name, real_name] : mapping) {
            auto port = ref_generator->get_port(real_name);
            def.emplace_back(std::make_tuple(var_name, port->width(), port->is_signed()));
        }
        auto struct_ = std::make_shared<PackedStruct>(bundle_name, def);
        for (auto const& [entry_name, generator] : generators) {
            auto* p = dynamic_cast<Generator*>(generator->parent());
            // move sources around the ports
            auto ref = generator->get_bundle_ref(entry_name);
            auto const& m = ref->name_mappings();
            auto dir = generator->get_port(m.begin()->second)->port_direction();
            auto& packed = generator->port_packed(dir, entry_name, struct_);

            for (auto const& [attr, real_name] : m) {
                auto target = generator->get_port(real_name);
                auto& slice = packed[attr];
                if (dir != target->port_direction())
                    throw InternalException("Direction doesn't match");
                // depends on the direction, the parent can change;
                if (dir == PortDirection::In) {
                    if (p) {
                        Var::move_src_to(target.get(), &slice, p, false);
                    }
                    Var::move_sink_to(target.get(), &slice, generator, false);
                } else {
                    Var::move_src_to(target.get(), &slice, generator, false);
                    if (p) {
                        Var::move_sink_to(target.get(), &slice, p, false);
                    }
                }
                // remove target
                generator->remove_port(real_name);
            }
            // remove bundle info
            generator->remove_bundle_port_ref(entry_name);
        }
    }
}